

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

float __thiscall Json::Value::asFloat(Value *this)

{
  runtime_error *this_00;
  float local_44;
  float local_3c;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._4_4_ = 0.0;
    break;
  case 1:
    this_local._4_4_ = (float)(this->value_).int_;
    break;
  case 2:
    local_3c = (float)(this->value_).uint_;
    this_local._4_4_ = local_3c;
    break;
  case 3:
    this_local._4_4_ = (float)(this->value_).real_;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to float.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    local_44 = 1.0;
    if (((this->value_).bool_ & 1U) == 0) {
      local_44 = 0.0;
    }
    this_local._4_4_ = local_44;
  }
  return this_local._4_4_;
}

Assistant:

float
Value::asFloat() const
{
   switch ( type_ )
   {
   case intValue:
      return static_cast<float>( value_.int_ );
   case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
      return static_cast<float>( value_.uint_ );
#else // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
      return integerToDouble( value_.uint_ );
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
   case realValue:
      return static_cast<float>( value_.real_ );
   case nullValue:
      return 0.0;
   case booleanValue:
      return value_.bool_ ? 1.0f : 0.0f;
   default:
      break;
   }
   JSON_FAIL_MESSAGE("Value is not convertible to float.");
}